

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.h
# Opt level: O1

void __thiscall
slang::ast::CaseStatement::visitExprs<cast_signed_index::MainVisitor&>
          (CaseStatement *this,AlwaysFFVisitor *visitor)

{
  pointer pIVar1;
  size_t sVar2;
  pointer ppEVar3;
  Expression *this_00;
  long lVar4;
  ItemGroup *item;
  pointer pIVar5;
  
  Expression::visitExpression<slang::ast::Expression_const,cast_signed_index::MainVisitor&>
            (this->expr,this->expr,visitor);
  sVar2 = (this->items)._M_extent._M_extent_value;
  if (sVar2 != 0) {
    pIVar5 = (this->items)._M_ptr;
    pIVar1 = pIVar5 + sVar2;
    do {
      sVar2 = (pIVar5->expressions)._M_extent._M_extent_value;
      if (sVar2 != 0) {
        ppEVar3 = (pIVar5->expressions)._M_ptr;
        lVar4 = 0;
        do {
          this_00 = *(Expression **)((long)ppEVar3 + lVar4);
          Expression::visitExpression<slang::ast::Expression_const,cast_signed_index::MainVisitor&>
                    (this_00,this_00,visitor);
          lVar4 = lVar4 + 8;
        } while (sVar2 << 3 != lVar4);
      }
      pIVar5 = pIVar5 + 1;
    } while (pIVar5 != pIVar1);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr.visit(visitor);
        for (auto& item : items) {
            for (auto itemExpr : item.expressions)
                itemExpr->visit(visitor);
        }
    }